

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::insert_node<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
          (hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
           *this,transaction_base *transaction,index_pointer node,
          pair<pstore::uint128,_pstore::extent<unsigned_char>_> *value,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  ulong uVar1;
  key_type *pkVar2;
  index_pointer iVar3;
  index_pointer iVar4;
  ulong extraout_RDX;
  undefined8 extraout_RDX_00;
  pair<pstore::index::details::index_pointer,_bool> pVar5;
  index_pointer node_local;
  
  node_local = node;
  if (((ulong)node.internal_ & 1) == 0) {
    if (((ulong)node.internal_ & 2) != 0) {
      __assert_fail("is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                    ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
    }
    pkVar2 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             ::get_key((key_type *)this,
                       (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                        *)transaction->db_,(database *)node.internal_,(address)value);
    if (pkVar2 == *(key_type **)&(value->first).v_ &&
        *(ulong *)((long)&(value->first).v_ + 8) == extraout_RDX) {
      if (is_upsert) {
        iVar3.addr_ = store_leaf_node<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                                (this,transaction,value,parents);
        pVar5._9_7_ = (int7)((ulong)extraout_RDX_00 >> 8);
        pVar5.second = true;
        pVar5.first.internal_ = iVar3.internal_;
      }
      else {
        uVar1 = (parents.ptr_)->elements_;
        if (0xc < uVar1) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        (parents.ptr_)->elements_ = uVar1 + 1;
        ((parents.ptr_)->c_)._M_elems[uVar1].node = node_local;
        ((parents.ptr_)->c_)._M_elems[uVar1].position = 0xffffffffffffffff;
        pVar5._9_7_ = (int7)(uVar1 + 1 >> 8);
        pVar5.second = true;
        pVar5.first.internal_ = node_local.internal_;
      }
    }
    else {
      iVar4 = insert_into_leaf<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                        (this,transaction,&node_local,value,extraout_RDX >> ((byte)shifts & 0x3f),
                         hash,shifts,parents);
      pVar5._8_8_ = 0;
      pVar5.first = iVar4;
    }
  }
  else if (shifts < 0x42) {
    pVar5 = insert_into_internal<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                      (this,transaction,node,value,hash,shifts,parents,is_upsert);
  }
  else {
    pVar5 = insert_into_linear<std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
                      (this,transaction,node,value,parents,is_upsert);
  }
  return pVar5;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_node (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;
            if (node.is_leaf ()) { // This node is a leaf node.
                key_type const existing_key =
                    get_key (transaction.db (), node.to_address ()); // Read key.
                if (equal_ (value.first, existing_key)) {
                    if (is_upsert) {
                        result = this->store_leaf_node (transaction, value, parents);
                    } else {
                        parents->push (details::parent_type{node});
                        result = node;
                    }
                    key_exists = true;
                } else {
                    auto const existing_hash =
                        static_cast<hash_type> ((hash_ (existing_key) >> shifts));
                    result = this->insert_into_leaf (transaction, node, value, existing_hash, hash,
                                                     shifts, parents);
                }
            } else {
                // This node is an internal or a linear node.
                if (details::depth_is_internal_node (shifts)) {
                    std::tie (result, key_exists) = this->insert_into_internal (
                        transaction, node, value, hash, shifts, parents, is_upsert);
                } else {
                    std::tie (result, key_exists) =
                        this->insert_into_linear (transaction, node, value, parents, is_upsert);
                }
            }

            return std::make_pair (result, key_exists);
        }